

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGet
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGet *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  ExternalInterface *pEVar2;
  Address local_e0;
  ModuleRunner *local_d8;
  size_t sStack_d0;
  Literal local_c8;
  uint64_t local_b0;
  uint64_t address;
  undefined8 uStack_a0;
  undefined1 local_90 [8];
  TableInstanceInfo info;
  undefined1 local_68 [8];
  Flow index;
  TableGet *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  index.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_00,
             *(Expression **)(index.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    address = (((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str)._M_len;
    uStack_a0 = *(undefined8 *)(index.breakTo.super_IString.str._M_str + 0x18);
    getTableInstanceInfo
              ((TableInstanceInfo *)local_90,this,
               (Name)((IString *)(index.breakTo.super_IString.str._M_str + 0x10))->str);
    Flow::getSingleValue((Flow *)local_68);
    local_b0 = ::wasm::Literal::getUnsigned();
    pEVar2 = TableInstanceInfo::interface((TableInstanceInfo *)local_90);
    local_d8 = info.instance;
    sStack_d0 = info.name.super_IString.str._M_len;
    Address::Address(&local_e0,local_b0);
    (*pEVar2->_vptr_ExternalInterface[0x1d])(&local_c8,pEVar2,local_d8,sStack_d0,local_e0.addr);
    Flow::Flow(__return_storage_ptr__,&local_c8);
    ::wasm::Literal::~Literal(&local_c8);
  }
  info.name.super_IString.str._M_str._0_4_ = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGet(TableGet* curr) {
    NOTE_ENTER("TableGet");
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    auto info = getTableInstanceInfo(curr->table);
    auto address = index.getSingleValue().getUnsigned();
    return info.interface()->tableLoad(info.name, address);
  }